

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O0

bool jbcoin::operator==(Book *lhs,Book *rhs)

{
  bool bVar1;
  bool local_19;
  Book *rhs_local;
  Book *lhs_local;
  
  bVar1 = operator==(&lhs->in,&rhs->in);
  local_19 = false;
  if (bVar1) {
    local_19 = operator==(&lhs->out,&rhs->out);
  }
  return local_19;
}

Assistant:

bool
operator== (Book const& lhs, Book const& rhs)
{
    return (lhs.in == rhs.in) &&
           (lhs.out == rhs.out);
}